

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O0

bool __thiscall
QCss::ValueExtractor::extractBackground
          (ValueExtractor *this,QBrush *brush,QString *image,Repeat *repeat,Alignment *alignment,
          Origin *origin,Attachment *attachment,Origin *clip)

{
  bool bVar1;
  undefined4 uVar2;
  Origin OVar3;
  Attachment AVar4;
  QCssKnownValue *start;
  qsizetype qVar5;
  BackgroundData *pal;
  const_reference pal_00;
  DeclarationData *pDVar6;
  quint64 qVar7;
  BrushData *in_RCX;
  BackgroundData *pBVar8;
  QList<QCss::Value> *in_RDX;
  QVariant *in_RDI;
  QString *in_R8;
  Origin *in_R9;
  long in_FS_OFFSET;
  Attachment *in_stack_00000008;
  Origin *in_stack_00000010;
  Value *val;
  Declaration *decl;
  int i;
  bool hit;
  BackgroundData data_1;
  BrushData brushData;
  BackgroundData data;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  BackgroundData *in_stack_fffffffffffffe80;
  int iVar9;
  uint3 in_stack_fffffffffffffeb4;
  uint uVar10;
  undefined1 local_118 [40];
  undefined4 local_f0;
  undefined4 local_ec;
  undefined1 *local_e0;
  undefined8 local_d8;
  undefined1 local_c8 [16];
  undefined1 auStack_b8 [24];
  undefined4 local_a0;
  undefined4 local_9c;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_94;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar10 = (uint)in_stack_fffffffffffffeb4;
  iVar9 = 0;
  do {
    start = (QCssKnownValue *)(long)iVar9;
    qVar5 = QList<QCss::Declaration>::size((QList<QCss::Declaration> *)in_RDI);
    if (qVar5 <= (long)start) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return (bool)((byte)(uVar10 >> 0x18) & 1);
      }
      __stack_chk_fail();
    }
    pal = (BackgroundData *)
          QList<QCss::Declaration>::at
                    ((QList<QCss::Declaration> *)in_stack_fffffffffffffe80,
                     CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
              ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa31e23);
    bVar1 = QList<QCss::Value>::isEmpty((QList<QCss::Value> *)0xa31e2f);
    if (!bVar1) {
      QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa31e53);
      pal_00 = QList<QCss::Value>::at
                         ((QList<QCss::Value> *)in_stack_fffffffffffffe80,
                          CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
      pDVar6 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                         ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)
                          0xa31e72);
      pBVar8 = (BackgroundData *)(ulong)(pDVar6->propertyId - BackgroundColor);
      switch(pBVar8) {
      case (BackgroundData *)0x0:
        pBVar8 = pal;
        QPalette::QPalette((QPalette *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78)
                          );
        Declaration::brushValue((Declaration *)pBVar8,(QPalette *)pal_00);
        QBrush::operator=((QBrush *)pal,
                          (QBrush *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
        QBrush::~QBrush((QBrush *)0xa31eed);
        QPalette::~QPalette((QPalette *)pal);
        in_stack_fffffffffffffe80 = pal;
        break;
      default:
        goto LAB_00a322b2;
      case (BackgroundData *)0x3b:
        QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                  ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa32071);
        bVar1 = ::QVariant::isValid((QVariant *)in_stack_fffffffffffffe80);
        if (bVar1) {
          memset(local_c8,0xaa,0x30);
          QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                    ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa320a7);
          qvariant_cast<QCss::BackgroundData>(in_RDI);
          brushFromData(&pBVar8->brush,(QPalette *)in_stack_fffffffffffffe80);
          QBrush::operator=((QBrush *)in_stack_fffffffffffffe80,
                            (QBrush *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78))
          ;
          QBrush::~QBrush((QBrush *)0xa320f8);
          QString::operator=((QString *)in_RDX,(QString *)auStack_b8);
          *(undefined4 *)
           &(in_RCX->brush).d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
            super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
            super__Head_base<0UL,_QBrushData_*,_false> = local_a0;
          *(undefined4 *)&(in_R8->d).d = local_9c;
          BackgroundData::~BackgroundData(in_stack_fffffffffffffe80);
        }
        else {
          local_e0 = &DAT_aaaaaaaaaaaaaaaa;
          local_d8 = &DAT_aaaaaaaaaaaaaaaa;
          BrushData::BrushData(&in_stack_fffffffffffffe80->brush);
          QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                    ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa32171);
          parseShorthandBackgroundProperty
                    (in_RDX,in_RCX,in_R8,in_R9,(Alignment *)CONCAT44(uVar10,iVar9),(QPalette *)pal);
          brushFromData(&pBVar8->brush,(QPalette *)in_stack_fffffffffffffe80);
          QBrush::operator=((QBrush *)in_stack_fffffffffffffe80,
                            (QBrush *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78))
          ;
          QBrush::~QBrush((QBrush *)0xa321da);
          if (local_d8._4_4_ != 3) {
            memset(local_118,0xaa,0x30);
            BrushData::BrushData
                      (&in_stack_fffffffffffffe80->brush,
                       (BrushData *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
            QString::QString((QString *)in_stack_fffffffffffffe80,
                             (QString *)
                             CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
            local_f0 = *(undefined4 *)
                        &(in_RCX->brush).d._M_t.
                         super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                         super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                         super__Head_base<0UL,_QBrushData_*,_false>;
            local_ec = *(undefined4 *)&(in_R8->d).d;
            ::QVariant::fromValue<QCss::BackgroundData>(pBVar8);
            QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                      ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa32259)
            ;
            ::QVariant::operator=((QVariant *)pBVar8,(QVariant *)in_stack_fffffffffffffe80);
            ::QVariant::~QVariant(&local_48);
            BackgroundData::~BackgroundData(in_stack_fffffffffffffe80);
          }
          BrushData::~BrushData((BrushData *)0xa32291);
        }
        break;
      case (BackgroundData *)0x3c:
        OVar3 = Declaration::originValue((Declaration *)pBVar8);
        *in_R9 = OVar3;
        break;
      case (BackgroundData *)0x3d:
        OVar3 = Declaration::originValue((Declaration *)pBVar8);
        *in_stack_00000010 = OVar3;
        break;
      case (BackgroundData *)0x3e:
        QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                  ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa31f4d);
        bVar1 = ::QVariant::isValid((QVariant *)in_stack_fffffffffffffe80);
        if (bVar1) {
          pDVar6 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                             ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)
                              0xa31f69);
          uVar2 = ::QVariant::toInt((bool *)&pDVar6->parsed);
          *(undefined4 *)
           &(in_RCX->brush).d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
            super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
            super__Head_base<0UL,_QBrushData_*,_false> = uVar2;
        }
        else {
          ::QVariant::toString();
          qVar7 = findKnownValue((QString *)in_RDI,start,(int)((ulong)pBVar8 >> 0x20));
          *(int *)&(in_RCX->brush).d._M_t.
                   super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                   super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                   super__Head_base<0UL,_QBrushData_*,_false> = (int)qVar7;
          QString::~QString((QString *)0xa31fcc);
          ::QVariant::QVariant
                    (&local_28,
                     *(int *)&(in_RCX->brush).d._M_t.
                              super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                              super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                              super__Head_base<0UL,_QBrushData_*,_false>);
          QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                    ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa31fea);
          ::QVariant::operator=((QVariant *)pBVar8,(QVariant *)in_stack_fffffffffffffe80);
          ::QVariant::~QVariant(&local_28);
        }
        break;
      case (BackgroundData *)0x3f:
        local_94.super_QFlagsStorage<Qt::AlignmentFlag>.i =
             (QFlagsStorage<Qt::AlignmentFlag>)Declaration::alignmentValue((Declaration *)start);
        *(QFlagsStorage<Qt::AlignmentFlag> *)&(in_R8->d).d =
             local_94.super_QFlagsStorage<Qt::AlignmentFlag>.i;
        break;
      case (BackgroundData *)0x40:
        AVar4 = Declaration::attachmentValue((Declaration *)pBVar8);
        *in_stack_00000008 = AVar4;
        break;
      case (BackgroundData *)0x41:
        if (pal_00->type == Uri) {
          ::QVariant::toString();
          QString::operator=((QString *)in_stack_fffffffffffffe80,
                             (QString *)
                             CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
          QString::~QString((QString *)0xa31f3e);
        }
      }
      uVar10 = CONCAT13(1,(int3)uVar10);
    }
LAB_00a322b2:
    iVar9 = iVar9 + 1;
  } while( true );
}

Assistant:

bool ValueExtractor::extractBackground(QBrush *brush, QString *image, Repeat *repeat,
                                       Qt::Alignment *alignment, Origin *origin, Attachment *attachment,
                                       Origin *clip)
{
    bool hit = false;
    for (int i = 0; i < declarations.size(); ++i) {
        const Declaration &decl = declarations.at(i);
        if (decl.d->values.isEmpty())
            continue;
        const QCss::Value &val = decl.d->values.at(0);
        switch (decl.d->propertyId) {
            case BackgroundColor:
                    *brush = decl.brushValue();
                break;
            case BackgroundImage:
                if (val.type == Value::Uri)
                    *image = val.variant.toString();
                break;
            case BackgroundRepeat:
                if (decl.d->parsed.isValid()) {
                    *repeat = static_cast<Repeat>(decl.d->parsed.toInt());
                } else {
                    *repeat = static_cast<Repeat>(findKnownValue(val.variant.toString(),
                                                  repeats, NumKnownRepeats));
                    decl.d->parsed = *repeat;
                }
                break;
            case BackgroundPosition:
                *alignment = decl.alignmentValue();
                break;
            case BackgroundOrigin:
                *origin = decl.originValue();
                break;
            case BackgroundClip:
                *clip = decl.originValue();
                break;
            case Background:
                if (decl.d->parsed.isValid()) {
                    BackgroundData data = qvariant_cast<BackgroundData>(decl.d->parsed);
                    *brush = brushFromData(data.brush, pal);
                    *image = data.image;
                    *repeat = data.repeat;
                    *alignment = data.alignment;
                } else {
                    BrushData brushData;
                    parseShorthandBackgroundProperty(decl.d->values, &brushData, image, repeat, alignment, pal);
                    *brush = brushFromData(brushData, pal);
                    if (brushData.type != BrushData::DependsOnThePalette) {
                        BackgroundData data = { brushData, *image, *repeat, *alignment };
                        decl.d->parsed = QVariant::fromValue<BackgroundData>(data);
                    }
                }
                break;
            case BackgroundAttachment:
                *attachment = decl.attachmentValue();
                break;
            default: continue;
        }
        hit = true;
    }
    return hit;
}